

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::CoreBroker(CoreBroker *this,bool setAsRootBroker)

{
  byte bVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  byte in_SIL;
  Broker *in_RDI;
  undefined8 in_stack_ffffffffffffffd8;
  __integral_type_conflict4 __i;
  Broker *this_00;
  UnknownHandleManager *in_stack_ffffffffffffffe0;
  SimpleQueue<helics::ActionMessage,_std::mutex> *this_01;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  Broker::Broker(in_RDI);
  BrokerBase::BrokerBase
            ((BrokerBase *)CONCAT17(bVar1,in_stack_fffffffffffffff0),SUB81((ulong)in_RDI >> 0x38,0))
  ;
  in_RDI->_vptr_Broker = (_func_int **)&PTR__CoreBroker_00a76210;
  in_RDI[1]._vptr_Broker = (_func_int **)&DAT_00a76360;
  *(undefined1 *)((long)&in_RDI[0x53]._vptr_Broker + 2) = 0;
  CLI::std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffffe0,
             SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0));
  *(byte *)((long)&in_RDI[0x53]._vptr_Broker + 4) = bVar1 & 1;
  *(undefined1 *)((long)&in_RDI[0x53]._vptr_Broker + 5) = 0;
  *(undefined1 *)((long)&in_RDI[0x53]._vptr_Broker + 6) = 0;
  *(undefined4 *)&in_RDI[0x54]._vptr_Broker = 1;
  gmlc::containers::
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  ::DualStringMappedVector
            ((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
              *)in_stack_ffffffffffffffe0);
  gmlc::containers::
  DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
  ::DualStringMappedVector
            ((DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
              *)in_stack_ffffffffffffffe0);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffff0));
  HandleManager::HandleManager((HandleManager *)in_stack_ffffffffffffffe0);
  UnknownHandleManager::UnknownHandleManager(in_stack_ffffffffffffffe0);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
            *)0x5f7de8);
  CLI::std::
  unordered_map<helics::GlobalFederateId,_helics::LocalFederateId,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>_>
  ::unordered_map((unordered_map<helics::GlobalFederateId,_helics::LocalFederateId,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::LocalFederateId>_>_>
                   *)0x5f7df9);
  CLI::std::
  unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
  ::unordered_map((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                   *)0x5f7e0a);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::route_id>_>_>
                   *)0x5f7e1b);
  CLI::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x5f7e2c);
  CLI::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                   *)0x5f7e3d);
  CLI::std::mutex::mutex((mutex *)0x5f7e4e);
  CLI::std::atomic<int>::atomic
            ((atomic<int> *)in_stack_ffffffffffffffe0,
             (__integral_type)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  __i = (__integral_type_conflict4)((ulong)in_stack_ffffffffffffffd8 >> 0x30);
  *(undefined1 *)((long)&in_RDI[0x141]._vptr_Broker + 4) = 0;
  gmlc::concurrency::
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  DelayedObjects((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffffe0);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::vector((vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
            *)0x5f7e8d);
  std::
  deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::deque((deque<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
           *)0x5f7e9e);
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::vector
            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x5f7eb1);
  gmlc::concurrency::TriggerVariable::TriggerVariable
            ((TriggerVariable *)in_stack_ffffffffffffffe0,SUB21(__i >> 8,0));
  std::make_unique<helics::TimeoutMonitor>();
  std::atomic<unsigned_short>::atomic((atomic<unsigned_short> *)in_stack_ffffffffffffffe0,__i);
  CLI::std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL>::
  array((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_3UL> *)
        CONCAT17(bVar1,in_stack_fffffffffffffff0));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffff0));
  this_00 = in_RDI + 0x1b7;
  memset(this_00,0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)this_00);
  this_01 = (SimpleQueue<helics::ActionMessage,_std::mutex> *)
            ((long)&in_RDI[0x1b7]._vptr_Broker + 4);
  memset(this_01,0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)this_01);
  in_RDI[0x1b8]._vptr_Broker = (_func_int **)0x0;
  TVar2 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[0x1b9]._vptr_Broker = (_func_int **)TVar2.internalTimeCode;
  TVar2 = TimeRepresentation<count_time<9,_long>_>::minVal();
  in_RDI[0x1ba]._vptr_Broker = (_func_int **)TVar2.internalTimeCode;
  std::atomic<double>::atomic((atomic<double> *)this_01,(double)this_00);
  TVar2 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[0x1bc]._vptr_Broker = (_func_int **)TVar2.internalTimeCode;
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::SimpleQueue(this_01);
  return;
}

Assistant:

CoreBroker::CoreBroker(bool setAsRootBroker) noexcept:
    _isRoot(setAsRootBroker), isRootc(setAsRootBroker),
    timeoutMon(std::make_unique<TimeoutMonitor>())
{
}